

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_from_bytes(uchar *bytes,size_t len,wally_psbt **output)

{
  wally_tx_witness_stack *stack;
  bool bVar1;
  bool bVar2;
  wally_psbt_input *bytes_len_out;
  wally_psbt_input *pwVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  int *piVar7;
  uint64_t uVar8;
  size_t sVar9;
  uint64_t uVar10;
  uchar *puVar11;
  wally_tx *pwVar12;
  wally_psbt_input *pwVar13;
  wally_psbt_output *pwVar14;
  size_t *bytes_len_out_00;
  uchar **ppuVar15;
  uchar **bytes_out;
  int iVar16;
  wally_tx_witness_stack ***pppwVar17;
  wally_tx_witness_stack ***pppwVar18;
  wally_tx_witness_stack ***pppwVar19;
  wally_psbt_output *pwVar20;
  _func_int_uchar_ptr_size_t *in_R9;
  int iVar21;
  ulong uVar22;
  wally_tx_witness_stack **output_00;
  undefined8 unaff_R15;
  wally_tx_witness_stack ***pppwVar23;
  uchar *val;
  uchar *key;
  wally_tx *tx;
  size_t val_max;
  wally_psbt *result;
  size_t key_len;
  size_t value_len;
  size_t asset_len;
  uchar *nonce;
  uchar *value;
  uchar *asset;
  size_t in_stack_fffffffffffffe30;
  long *local_198;
  uchar *local_190;
  size_t local_188;
  wally_tx_witness_stack **local_180;
  wally_tx *local_178;
  uchar *local_170;
  wally_tx_witness_stack **local_168;
  undefined8 local_160;
  wally_psbt_input *local_158;
  wally_psbt *local_150;
  wally_psbt_input *local_148;
  undefined8 local_140;
  uchar **local_138;
  uchar **local_130;
  uchar **local_128;
  uchar **local_120;
  uchar **local_118;
  uchar **local_110;
  wally_psbt_input *local_108;
  wally_psbt_input *local_100;
  wally_psbt_input *local_f8;
  wally_psbt_input *local_f0;
  wally_psbt_input *local_e8;
  wally_psbt_input *local_e0;
  wally_psbt_input *local_d8;
  wally_psbt_input *local_d0;
  wally_psbt_output *local_c8;
  wally_psbt_output *local_c0;
  wally_psbt_output *local_b8;
  wally_psbt_input *local_b0;
  uchar **local_a8;
  wally_psbt_input *local_a0;
  size_t local_98;
  wally_psbt **local_90;
  size_t *local_88;
  size_t *local_80;
  size_t *local_78;
  size_t *local_70;
  uchar **local_68;
  size_t local_60;
  _func_int_uchar_ptr_size_t *local_58;
  size_t local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  local_150 = (wally_psbt *)0x0;
  if (output == (wally_psbt **)0x0) {
    pppwVar18 = (wally_tx_witness_stack ***)0xfffffffe;
    goto LAB_004b4cd1;
  }
  *output = (wally_psbt *)0x0;
  local_188 = len;
  local_180 = (wally_tx_witness_stack **)bytes;
  piVar7 = (int *)pull_skip((uchar **)&local_180,&local_188,5);
  if (piVar7 == (int *)0x0) {
LAB_004b4c5e:
    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
  }
  else {
    bVar2 = (char)piVar7[1] == -1;
    bVar1 = !bVar2 || *piVar7 != 0x74627370;
    pppwVar23 = (wally_tx_witness_stack ***)CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar1);
    if (bVar2 && *piVar7 == 0x74627370) {
      local_140 = (wally_map *)((ulong)local_140._4_4_ << 0x20);
      local_160 = (wally_tx_witness_stack **)CONCAT44(local_160._4_4_,8);
    }
    else {
      if ((char)piVar7[1] != -1 || *piVar7 != 0x74657370) goto LAB_004b4c5e;
      local_160 = (wally_tx_witness_stack **)((ulong)local_160._4_4_ << 0x20);
      local_140 = (wally_map *)CONCAT44(local_140._4_4_,2);
    }
    local_90 = output;
    uVar4 = wally_psbt_init_alloc(0,0,0,8,&local_150);
    pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
    if (uVar4 == 0) {
      local_e8 = (wally_psbt_input *)CONCAT44(local_e8._4_4_,(uint)bVar1);
      local_150->magic[4] = (uchar)piVar7[1];
      *(int *)local_150->magic = *piVar7;
      pppwVar18 = &local_180;
      local_168 = local_180;
      local_160 = (wally_tx_witness_stack **)
                  CONCAT44(local_160._4_4_,(uint)local_160 | (uint)local_140);
      pppwVar19 = (wally_tx_witness_stack ***)0x0;
      do {
        local_98 = pull_varlength((uchar **)pppwVar18,&local_188);
        if (local_98 == 0) {
          if ((local_180 == (wally_tx_witness_stack **)0x0) || (local_150->tx == (wally_tx *)0x0))
          goto LAB_004b4c5e;
          if (local_150->tx->num_inputs == 0) goto LAB_004b5f27;
          pwVar13 = (wally_psbt_input *)0x0;
          goto LAB_004b4f84;
        }
        pull_subfield_start((uchar **)pppwVar18,&local_188,local_98,&local_190,&local_98);
        uVar8 = pull_varint(&local_190,&local_98);
        if (uVar8 == 0xfb) {
          pppwVar23 = (wally_tx_witness_stack ***)0x2;
          if (local_150->version == 0) {
            subfield_nomore_end((uchar **)pppwVar18,&local_188,local_190,local_98);
            uVar8 = pull_varint((uchar **)pppwVar18,&local_188);
            pull_subfield_start((uchar **)pppwVar18,&local_188,uVar8,(uchar **)&local_198,
                                (size_t *)&local_170);
            uVar5 = pull_le32((uchar **)&local_198,(size_t *)&local_170);
            local_150->version = uVar5;
            subfield_nomore_end((uchar **)pppwVar18,&local_188,(uchar *)local_198,(size_t)local_170)
            ;
            pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
            if (local_150->version == 0) goto LAB_004b4f18;
          }
          else {
            pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
          }
        }
        else if (uVar8 == 0) {
          subfield_nomore_end((uchar **)pppwVar18,&local_188,local_190,local_98);
          uVar8 = pull_varint((uchar **)pppwVar18,&local_188);
          pull_subfield_start((uchar **)pppwVar18,&local_188,uVar8,(uchar **)&local_198,
                              (size_t *)&local_170);
          uVar4 = wally_tx_from_bytes((uchar *)local_198,(size_t)local_170,(uint)local_160,
                                      &local_178);
          pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
          if (uVar4 == 0) {
            pppwVar17 = (wally_tx_witness_stack ***)0x0;
            uVar4 = psbt_set_global_tx(local_150,local_178,false);
            if (uVar4 != 0) {
              wally_tx_free(local_178);
              pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
            }
          }
          pppwVar23 = (wally_tx_witness_stack ***)0x2;
          if ((int)pppwVar17 == 0) {
            pull_subfield_end((uchar **)pppwVar18,&local_188,(uchar *)local_198,(size_t)local_170);
            pppwVar19 = pppwVar17;
LAB_004b4f18:
            pppwVar17 = pppwVar19;
            pppwVar23 = (wally_tx_witness_stack ***)0x0;
            local_168 = local_180;
          }
        }
        else {
          uVar4 = pull_unknown_key_value
                            ((uchar **)pppwVar18,&local_188,(uchar *)local_168,&local_150->unknowns)
          ;
          if (uVar4 == 0) {
            pppwVar19 = (wally_tx_witness_stack ***)0x0;
            goto LAB_004b4f18;
          }
          pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
          pppwVar23 = (wally_tx_witness_stack ***)0x2;
        }
        pppwVar19 = pppwVar17;
      } while ((int)pppwVar23 == 0);
      if ((int)pppwVar23 != 2) goto LAB_004b4cd1;
    }
  }
  goto LAB_004b4cc4;
  while (pwVar13 = (wally_psbt_input *)((long)&local_e0->utxo + 1),
        pwVar13 < (wally_psbt_input *)local_150->tx->num_inputs) {
LAB_004b4f84:
    local_158 = local_150->inputs;
    local_148 = local_158 + (long)pwVar13;
    local_110 = &local_158[(long)pwVar13].claim_script;
    local_a8 = (uchar **)&local_158[(long)pwVar13].claim_script_len;
    local_120 = &local_158[(long)pwVar13].genesis_blockhash;
    local_70 = &local_158[(long)pwVar13].genesis_blockhash_len;
    local_118 = &local_158[(long)pwVar13].txoutproof;
    local_68 = (uchar **)&local_158[(long)pwVar13].txoutproof_len;
    local_108 = (wally_psbt_input *)&local_158[(long)pwVar13].pegin_tx;
    local_128 = &local_158[(long)pwVar13].abf;
    local_78 = &local_158[(long)pwVar13].abf_len;
    local_130 = &local_158[(long)pwVar13].asset;
    local_80 = &local_158[(long)pwVar13].asset_len;
    local_138 = &local_158[(long)pwVar13].vbf;
    local_88 = &local_158[(long)pwVar13].vbf_len;
    output_00 = &local_158[(long)pwVar13].final_witness;
    local_b8 = (wally_psbt_output *)&local_158[(long)pwVar13].final_scriptsig;
    local_f0 = (wally_psbt_input *)&local_158[(long)pwVar13].final_scriptsig_len;
    local_a0 = (wally_psbt_input *)&local_158[(long)pwVar13].keypaths;
    local_c0 = (wally_psbt_output *)&local_158[(long)pwVar13].witness_script;
    local_f8 = (wally_psbt_input *)&local_158[(long)pwVar13].witness_script_len;
    local_c8 = (wally_psbt_output *)&local_158[(long)pwVar13].redeem_script;
    local_100 = (wally_psbt_input *)&local_158[(long)pwVar13].redeem_script_len;
    local_d8 = (wally_psbt_input *)&local_158[(long)pwVar13].signatures;
    local_d0 = (wally_psbt_input *)&local_158[(long)pwVar13].witness_utxo;
    local_b0 = (wally_psbt_input *)&local_158[(long)pwVar13].unknowns;
    local_160 = local_180;
    local_168 = output_00;
    local_e0 = pwVar13;
    do {
      local_190 = (uchar *)pull_varlength((uchar **)&local_180,&local_188);
      if (local_190 == (uchar *)0x0) {
        pppwVar17 = (wally_tx_witness_stack ***)0x0;
        break;
      }
      pull_subfield_start((uchar **)&local_180,&local_188,(size_t)local_190,(uchar **)&local_198,
                          (size_t *)&local_190);
      uVar8 = pull_varint((uchar **)&local_198,(size_t *)&local_190);
      pwVar13 = local_148;
      switch(uVar8) {
      case 0:
        if (local_148->utxo != (wally_tx *)0x0) break;
        subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
        uVar8 = pull_varint((uchar **)&local_180,&local_188);
        pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,(size_t *)&local_178);
        uVar4 = wally_tx_from_bytes(local_170,(size_t)local_178,(uint)local_140,&pwVar13->utxo);
        if (uVar4 == 0) {
          pull_subfield_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
          goto LAB_004b58a4;
        }
        goto LAB_004b53fc;
      case 1:
        pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
        if (local_d0->utxo == (wally_tx *)0x0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          uVar8 = pull_varint((uchar **)&local_180,&local_188);
          pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,(size_t *)&local_178)
          ;
          if ((int)local_e8 == 0) {
            uVar8 = pull_le64(&local_170,(size_t *)&local_178);
            uVar10 = pull_varint(&local_170,(size_t *)&local_178);
            puVar11 = pull_skip(&local_170,(size_t *)&local_178,uVar10);
            if (uVar10 == 0 || puVar11 == (uchar *)0x0) {
              bVar1 = false;
              output_00 = local_168;
            }
            else {
              uVar4 = wally_tx_output_init_alloc(uVar8,puVar11,uVar10,(wally_tx_output **)local_d0);
              if (uVar4 == 0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
                bVar1 = true;
                pppwVar17 = (wally_tx_witness_stack ***)((ulong)pppwVar23 & 0xffffffff);
                output_00 = local_168;
              }
              else {
                pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                bVar1 = false;
                output_00 = local_168;
              }
            }
          }
          else {
            in_R9 = (_func_int_uchar_ptr_size_t *)&DAT_0000000b;
            uVar4 = pull_elements_confidential
                              (&local_170,(size_t *)&local_178,&local_38,&local_50,10,0xb,0x21,
                               in_stack_fffffffffffffe30);
            if (uVar4 != 0) {
              bVar1 = false;
              pppwVar23 = (wally_tx_witness_stack ***)(ulong)uVar4;
              goto LAB_004b5844;
            }
            in_R9 = (_func_int_uchar_ptr_size_t *)0x9;
            uVar4 = pull_elements_confidential
                              (&local_170,(size_t *)&local_178,&local_40,(size_t *)&local_58,8,9,9,
                               in_stack_fffffffffffffe30);
            pppwVar18 = (wally_tx_witness_stack ***)(ulong)uVar4;
            if (uVar4 == 0) {
              in_R9 = (_func_int_uchar_ptr_size_t *)0x3;
              uVar4 = pull_elements_confidential
                                (&local_170,(size_t *)&local_178,&local_48,&local_60,2,3,0x21,
                                 in_stack_fffffffffffffe30);
              pppwVar18 = (wally_tx_witness_stack ***)(ulong)uVar4;
              if (uVar4 != 0) goto LAB_004b583f;
              uVar8 = pull_varint(&local_170,(size_t *)&local_178);
              puVar11 = pull_skip(&local_170,(size_t *)&local_178,uVar8);
              if (uVar8 == 0 || puVar11 == (uchar *)0x0) {
                pppwVar23 = (wally_tx_witness_stack ***)0xfffffffe;
                bVar1 = false;
                output_00 = local_168;
              }
              else {
                in_R9 = local_58;
                in_stack_fffffffffffffe30 = local_60;
                uVar4 = wally_tx_elements_output_init_alloc
                                  (puVar11,uVar8,local_38,local_50,local_40,(size_t)local_58,
                                   local_48,local_60,(uchar *)0x0,0,(uchar *)0x0,0,
                                   (wally_tx_output **)local_d0);
                output_00 = local_168;
                pppwVar18 = (wally_tx_witness_stack ***)(ulong)uVar4;
                if (uVar4 != 0) goto LAB_004b583f;
                subfield_nomore_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
                bVar1 = true;
              }
            }
            else {
LAB_004b583f:
              bVar1 = false;
              pppwVar23 = pppwVar18;
            }
LAB_004b5844:
            pppwVar17 = (wally_tx_witness_stack ***)((ulong)pppwVar23 & 0xffffffff);
          }
        }
        else {
          bVar1 = false;
        }
        pppwVar23 = pppwVar17;
        if (bVar1) goto LAB_004b58a4;
        goto LAB_004b53fe;
      case 2:
        pwVar13 = local_d8;
        goto LAB_004b53ef;
      case 3:
        if (local_148->sighash == 0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          uVar8 = pull_varint((uchar **)&local_180,&local_188);
          pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,(size_t *)&local_178)
          ;
          uVar5 = pull_le32(&local_170,(size_t *)&local_178);
          pwVar13->sighash = uVar5;
          subfield_nomore_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
          output_00 = local_168;
          goto LAB_004b58a4;
        }
        pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
        bVar1 = false;
        output_00 = local_168;
        goto LAB_004b58b3;
      case 4:
        if (local_c8->redeem_script == (uchar *)0x0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          sVar9 = pull_varlength((uchar **)&local_180,&local_188);
          puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
          if (sVar9 == 0) {
            puVar11 = (uchar *)wally_malloc(1);
            pwVar14 = local_c8;
            goto LAB_004b573c;
          }
          pwVar13 = local_100;
          pwVar14 = local_c8;
          if (local_158 == (wally_psbt_input *)0x0) goto LAB_004b5612;
LAB_004b557f:
          uVar4 = replace_bytes(puVar11,sVar9,&pwVar14->redeem_script,(size_t *)pwVar13);
          pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
LAB_004b5617:
          if ((int)pppwVar17 == 0) goto LAB_004b58a4;
          goto LAB_004b53fe;
        }
        break;
      case 5:
        if (local_c0->redeem_script == (uchar *)0x0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          sVar9 = pull_varlength((uchar **)&local_180,&local_188);
          puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
          pwVar13 = local_f8;
          pwVar14 = local_c0;
          if (sVar9 != 0) {
joined_r0x004b537f:
            if (local_158 != (wally_psbt_input *)0x0) goto LAB_004b557f;
LAB_004b5612:
            pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
            goto LAB_004b5617;
          }
          puVar11 = (uchar *)wally_malloc(1);
          pwVar14 = local_c0;
LAB_004b573c:
          pwVar14->redeem_script = puVar11;
          goto LAB_004b58a4;
        }
        break;
      case 6:
        pwVar13 = local_a0;
LAB_004b53ef:
        uVar4 = pull_map((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190,
                         (wally_map *)pwVar13,in_R9);
LAB_004b53f4:
        if (uVar4 != 0) {
LAB_004b53fc:
          pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
          goto LAB_004b53fe;
        }
LAB_004b58a4:
        bVar1 = true;
        local_160 = local_180;
LAB_004b58b0:
        pppwVar17 = (wally_tx_witness_stack ***)((ulong)pppwVar23 & 0xffffffff);
        goto LAB_004b58b3;
      case 7:
        if (local_b8->redeem_script == (uchar *)0x0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          sVar9 = pull_varlength((uchar **)&local_180,&local_188);
          puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
          pwVar13 = local_f0;
          pwVar14 = local_b8;
          if (sVar9 != 0) goto joined_r0x004b537f;
          puVar11 = (uchar *)wally_malloc(1);
          pwVar14 = local_b8;
          goto LAB_004b573c;
        }
        break;
      case 8:
        if (*output_00 == (wally_tx_witness_stack *)0x0) {
          subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190);
          uVar8 = pull_varint((uchar **)&local_180,&local_188);
          pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,(size_t *)&local_178)
          ;
          output_00 = local_168;
          uVar8 = pull_varint(&local_170,(size_t *)&local_178);
          uVar4 = wally_tx_witness_stack_init_alloc(uVar8,output_00);
          if (uVar4 == 0) {
            uVar22 = (ulong)pppwVar23 & 0xffffffff;
            uVar4 = (uint)pppwVar23;
            if (uVar8 != 0) {
              sVar9 = 0;
              do {
                uVar10 = pull_varint(&local_170,(size_t *)&local_178);
                stack = *local_168;
                puVar11 = pull_skip(&local_170,(size_t *)&local_178,uVar10);
                uVar6 = wally_tx_witness_stack_set(stack,sVar9,puVar11,uVar10);
                if (uVar6 != 0) {
                  uVar22 = (ulong)uVar6;
                }
                uVar4 = (uint)uVar22;
                if (uVar6 != 0) {
                  bVar1 = false;
                  goto LAB_004b585e;
                }
                sVar9 = sVar9 + 1;
              } while (uVar8 != sVar9);
            }
            subfield_nomore_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
            bVar1 = true;
LAB_004b585e:
            pppwVar23 = (wally_tx_witness_stack ***)(ulong)uVar4;
            output_00 = local_168;
          }
          else {
            bVar1 = false;
            pppwVar23 = (wally_tx_witness_stack ***)(ulong)uVar4;
          }
        }
        else {
          pppwVar23 = (wally_tx_witness_stack ***)0xfffffffe;
          bVar1 = false;
        }
        if (bVar1) goto LAB_004b58a4;
        bVar1 = false;
        goto LAB_004b58b0;
      default:
        pppwVar17 = pppwVar23;
        if (uVar8 == 0xfc) {
          sVar9 = pull_varlength((uchar **)&local_198,(size_t *)&local_190);
          iVar21 = 8;
          if ((sVar9 == 8) && (*local_198 == 0x73746e656d656c65)) {
            pull_skip((uchar **)&local_198,(size_t *)&local_190,8);
            uVar8 = pull_varint((uchar **)&local_198,(size_t *)&local_190);
            switch(uVar8) {
            case 0:
              if (local_148->has_value == 0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                uVar8 = pull_varint((uchar **)&local_180,&local_188);
                pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,
                                    (size_t *)&local_178);
                output_00 = local_168;
                uVar8 = pull_le64(&local_170,(size_t *)&local_178);
                local_148->value = uVar8;
                subfield_nomore_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
                local_148->has_value = 1;
LAB_004b5ef1:
                iVar21 = 4;
                goto switchD_004b5661_default;
              }
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              break;
            case 1:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_138 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 != 0) {
                  pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                  if ((local_158 != (wally_psbt_input *)0x0) &&
                     (bytes_len_out_00 = local_88, ppuVar15 = local_138,
                     (sVar9 != 0x20) != (puVar11 != (uchar *)0x0))) {
LAB_004b5ce7:
                    uVar4 = replace_bytes(puVar11,sVar9,ppuVar15,bytes_len_out_00);
                    pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                  }
                  goto LAB_004b5cee;
                }
                puVar11 = (uchar *)wally_malloc(1);
                ppuVar15 = local_138;
LAB_004b5ee9:
                *ppuVar15 = puVar11;
                goto LAB_004b5ef1;
              }
              break;
            case 2:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_130 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 == 0) {
                  puVar11 = (uchar *)wally_malloc(1);
                  ppuVar15 = local_130;
                  goto LAB_004b5ee9;
                }
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                if ((local_158 != (wally_psbt_input *)0x0) &&
                   (bytes_len_out_00 = local_80, ppuVar15 = local_130,
                   (sVar9 != 0x20) != (puVar11 != (uchar *)0x0))) goto LAB_004b5ce7;
LAB_004b5cee:
                iVar16 = (int)pppwVar17;
joined_r0x004b5e65:
                iVar21 = 1;
                if (iVar16 == 0) goto LAB_004b5ef1;
              }
              break;
            case 3:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_128 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 == 0) {
                  puVar11 = (uchar *)wally_malloc(1);
                  ppuVar15 = local_128;
                  goto LAB_004b5ee9;
                }
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                if ((local_158 != (wally_psbt_input *)0x0) &&
                   (bytes_len_out_00 = local_78, ppuVar15 = local_128,
                   (sVar9 != 0x20) != (puVar11 != (uchar *)0x0))) goto LAB_004b5ce7;
                goto LAB_004b5cee;
              }
              break;
            case 4:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (local_108->utxo == (wally_tx *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                uVar8 = pull_varint((uchar **)&local_180,&local_188);
                pull_subfield_start((uchar **)&local_180,&local_188,uVar8,&local_170,
                                    (size_t *)&local_178);
                uVar4 = wally_tx_from_bytes(local_170,(size_t)local_178,(uint)local_140,
                                            &local_108->utxo);
                pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                if (uVar4 == 0) {
                  pull_subfield_end((uchar **)&local_180,&local_188,local_170,(size_t)local_178);
                  goto LAB_004b5ef1;
                }
              }
              break;
            case 5:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_118 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 == 0) {
                  puVar11 = (uchar *)wally_malloc(1);
                  ppuVar15 = local_118;
                  goto LAB_004b5ed2;
                }
                ppuVar15 = local_68;
                bytes_out = local_118;
                if (local_158 == (wally_psbt_input *)0x0) goto LAB_004b5e5e;
LAB_004b5c48:
                uVar4 = replace_bytes(puVar11,sVar9,bytes_out,(size_t *)ppuVar15);
                pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
LAB_004b5e63:
                iVar16 = (int)pppwVar17;
                goto joined_r0x004b5e65;
              }
              break;
            case 6:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_120 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 == 0) {
                  puVar11 = (uchar *)wally_malloc(1);
                  ppuVar15 = local_120;
                  goto LAB_004b5ee9;
                }
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                if ((local_158 != (wally_psbt_input *)0x0) &&
                   (bytes_len_out_00 = local_70, ppuVar15 = local_120,
                   (sVar9 != 0x20) != (puVar11 != (uchar *)0x0))) goto LAB_004b5ce7;
                goto LAB_004b5cee;
              }
              break;
            case 7:
              pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
              iVar21 = 1;
              if (*local_110 == (uchar *)0x0) {
                subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                    (size_t)local_190);
                sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                if (sVar9 != 0) {
                  ppuVar15 = local_a8;
                  bytes_out = local_110;
                  if (local_158 != (wally_psbt_input *)0x0) goto LAB_004b5c48;
LAB_004b5e5e:
                  pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                  goto LAB_004b5e63;
                }
                puVar11 = (uchar *)wally_malloc(1);
                ppuVar15 = local_110;
LAB_004b5ed2:
                *ppuVar15 = puVar11;
                goto LAB_004b5ef1;
              }
              break;
            default:
              goto switchD_004b5661_default;
            }
          }
          else {
switchD_004b5661_default:
            pppwVar17 = (wally_tx_witness_stack ***)((ulong)pppwVar23 & 0xffffffff);
          }
          pppwVar23 = pppwVar17;
          if (iVar21 == 4) goto LAB_004b58a4;
          if (iVar21 != 8) {
            bVar1 = false;
            goto LAB_004b58b3;
          }
        }
        uVar4 = pull_unknown_key_value
                          ((uchar **)&local_180,&local_188,(uchar *)local_160,(wally_map *)local_b0)
        ;
        pppwVar23 = pppwVar17;
        goto LAB_004b53f4;
      }
      pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
LAB_004b53fe:
      bVar1 = false;
LAB_004b58b3:
      pppwVar23 = pppwVar17;
    } while (bVar1);
    if ((int)pppwVar17 != 0) goto LAB_004b4cc4;
  }
LAB_004b5f27:
  if (local_150->tx->num_outputs != 0) {
    pwVar14 = (wally_psbt_output *)0x0;
    do {
      pwVar20 = local_150->outputs;
      local_148 = (wally_psbt_input *)(pwVar20 + (long)pwVar14);
      local_e0 = (wally_psbt_input *)&pwVar20[(long)pwVar14].nonce;
      local_120 = (uchar **)&pwVar20[(long)pwVar14].nonce_len;
      local_108 = (wally_psbt_input *)&pwVar20[(long)pwVar14].blinding_pubkey;
      local_d8 = (wally_psbt_input *)&pwVar20[(long)pwVar14].surjectionproof;
      local_110 = (uchar **)&pwVar20[(long)pwVar14].surjectionproof_len;
      local_158 = (wally_psbt_input *)&pwVar20[(long)pwVar14].rangeproof;
      local_118 = (uchar **)&pwVar20[(long)pwVar14].rangeproof_len;
      local_e8 = (wally_psbt_input *)&pwVar20[(long)pwVar14].abf;
      local_128 = (uchar **)&pwVar20[(long)pwVar14].abf_len;
      local_f0 = (wally_psbt_input *)&pwVar20[(long)pwVar14].asset_commitment;
      local_130 = (uchar **)&pwVar20[(long)pwVar14].asset_commitment_len;
      local_f8 = (wally_psbt_input *)&pwVar20[(long)pwVar14].vbf;
      local_138 = (uchar **)&pwVar20[(long)pwVar14].vbf_len;
      local_100 = (wally_psbt_input *)&pwVar20[(long)pwVar14].value_commitment;
      local_a8 = (uchar **)&pwVar20[(long)pwVar14].value_commitment_len;
      local_b8 = (wally_psbt_output *)&pwVar20[(long)pwVar14].keypaths;
      local_b0 = (wally_psbt_input *)&pwVar20[(long)pwVar14].witness_script;
      local_d0 = (wally_psbt_input *)&pwVar20[(long)pwVar14].witness_script_len;
      local_a0 = (wally_psbt_input *)&pwVar20[(long)pwVar14].redeem_script_len;
      local_140 = &pwVar20[(long)pwVar14].unknowns;
      local_168 = local_180;
      local_c8 = pwVar14;
      local_c0 = pwVar20;
      do {
        local_190 = (uchar *)pull_varlength((uchar **)&local_180,&local_188);
        if (local_190 == (uchar *)0x0) {
          pppwVar17 = (wally_tx_witness_stack ***)0x0;
          break;
        }
        pull_subfield_start((uchar **)&local_180,&local_188,(size_t)local_190,(uchar **)&local_198,
                            (size_t *)&local_190);
        uVar8 = pull_varint((uchar **)&local_198,(size_t *)&local_190);
        pwVar3 = local_b0;
        pwVar13 = local_148;
        if ((long)uVar8 < 2) {
          if (uVar8 == 0) {
            if (local_148->utxo == (wally_tx *)0x0) {
              subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                  (size_t)local_190);
              sVar9 = pull_varlength((uchar **)&local_180,&local_188);
              pwVar20 = local_c0;
              puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
              bytes_len_out = local_a0;
              pwVar3 = local_148;
joined_r0x004b6227:
              if (sVar9 == 0) {
                pwVar12 = (wally_tx *)wally_malloc(1);
                pwVar13->utxo = pwVar12;
              }
              else {
                if (pwVar20 == (wally_psbt_output *)0x0) {
                  pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                }
                else {
                  uVar4 = replace_bytes(puVar11,sVar9,(uchar **)pwVar3,(size_t *)bytes_len_out);
                  pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                }
                if ((int)pppwVar17 != 0) goto LAB_004b61e7;
              }
LAB_004b63d8:
              bVar1 = true;
              local_168 = local_180;
              pppwVar17 = (wally_tx_witness_stack ***)((ulong)local_160 & 0xffffffff);
              goto LAB_004b63e8;
            }
          }
          else {
            if (uVar8 != 1) {
LAB_004b61c5:
              uVar4 = pull_unknown_key_value
                                ((uchar **)&local_180,&local_188,(uchar *)local_168,local_140);
              goto LAB_004b61dd;
            }
            if (local_b0->utxo == (wally_tx *)0x0) {
              subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                  (size_t)local_190);
              sVar9 = pull_varlength((uchar **)&local_180,&local_188);
              puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
              bytes_len_out = local_d0;
              pwVar13 = pwVar3;
              pwVar3 = local_b0;
              goto joined_r0x004b6227;
            }
          }
          bVar1 = false;
          pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
        }
        else {
          if (uVar8 == 2) {
            uVar4 = pull_map((uchar **)&local_180,&local_188,(uchar *)local_198,(size_t)local_190,
                             (wally_map *)local_b8,in_R9);
LAB_004b61dd:
            pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
            if (uVar4 == 0) goto LAB_004b63d8;
          }
          else {
            if (uVar8 != 0xfc) goto LAB_004b61c5;
            sVar9 = pull_varlength((uchar **)&local_198,(size_t *)&local_190);
            iVar21 = 5;
            if ((sVar9 == 8) && (*local_198 == 0x73746e656d656c65)) {
              pull_skip((uchar **)&local_198,(size_t *)&local_190,8);
              uVar8 = pull_varint((uchar **)&local_198,(size_t *)&local_190);
              switch(uVar8) {
              case 0:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_100->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_100;
                  if (sVar9 == 0) goto LAB_004b67f6;
                  pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                  if ((pwVar20 != (wally_psbt_output *)0x0) &&
                     (ppuVar15 = local_a8, (sVar9 != 0x21) != (puVar11 != (uchar *)0x0))) {
LAB_004b66de:
                    uVar4 = replace_bytes(puVar11,sVar9,(uchar **)pwVar13,(size_t *)ppuVar15);
                    pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                  }
LAB_004b66e5:
                  uVar4 = (uint)pppwVar17;
LAB_004b66e7:
                  iVar21 = 1;
                  if (uVar4 != 0) break;
LAB_004b6803:
                  iVar21 = 4;
                  goto LAB_004b6167;
                }
                break;
              case 1:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_f8->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_f8;
                  if (sVar9 != 0) {
                    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                    if ((pwVar20 != (wally_psbt_output *)0x0) &&
                       (ppuVar15 = local_138, (sVar9 != 0x20) != (puVar11 != (uchar *)0x0)))
                    goto LAB_004b66de;
                    goto LAB_004b66e5;
                  }
LAB_004b67f6:
                  pwVar12 = (wally_tx *)wally_malloc(1);
                  pwVar13->utxo = pwVar12;
                  goto LAB_004b6803;
                }
                break;
              case 2:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_f0->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_f0;
                  if (sVar9 != 0) {
                    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                    if ((pwVar20 != (wally_psbt_output *)0x0) &&
                       (ppuVar15 = local_130, (sVar9 != 0x21) != (puVar11 != (uchar *)0x0)))
                    goto LAB_004b66de;
                    goto LAB_004b66e5;
                  }
                  goto LAB_004b67f6;
                }
                break;
              case 3:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_e8->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_e8;
                  if (sVar9 != 0) {
                    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                    if ((pwVar20 != (wally_psbt_output *)0x0) &&
                       (ppuVar15 = local_128, (sVar9 != 0x20) != (puVar11 != (uchar *)0x0)))
                    goto LAB_004b66de;
                    goto LAB_004b66e5;
                  }
                  goto LAB_004b67f6;
                }
                break;
              case 4:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_158->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_158;
                  if (sVar9 == 0) goto LAB_004b67f6;
                  ppuVar15 = local_118;
                  if (pwVar20 == (wally_psbt_output *)0x0) goto LAB_004b681b;
LAB_004b6774:
                  uVar4 = replace_bytes(puVar11,sVar9,(uchar **)pwVar13,(size_t *)ppuVar15);
                  pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
LAB_004b6820:
                  iVar21 = 1;
                  if ((int)pppwVar17 == 0) goto LAB_004b6803;
                }
                break;
              case 5:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_d8->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_d8;
                  if (sVar9 != 0) {
                    ppuVar15 = local_110;
                    if (pwVar20 != (wally_psbt_output *)0x0) goto LAB_004b6774;
LAB_004b681b:
                    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                    goto LAB_004b6820;
                  }
                  goto LAB_004b67f6;
                }
                break;
              case 6:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_108->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_108;
                  if (sVar9 != 0) {
                    uVar4 = wally_psbt_output_set_blinding_pubkey
                                      ((wally_psbt_output *)local_148,puVar11,sVar9);
                    pppwVar17 = (wally_tx_witness_stack ***)(ulong)uVar4;
                    goto LAB_004b66e7;
                  }
                  goto LAB_004b67f6;
                }
                break;
              case 7:
                pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                iVar21 = 1;
                if (local_e0->utxo == (wally_tx *)0x0) {
                  subfield_nomore_end((uchar **)&local_180,&local_188,(uchar *)local_198,
                                      (size_t)local_190);
                  sVar9 = pull_varlength((uchar **)&local_180,&local_188);
                  puVar11 = pull_skip((uchar **)&local_180,&local_188,sVar9);
                  pwVar13 = local_e0;
                  if (sVar9 != 0) {
                    pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
                    if ((pwVar20 != (wally_psbt_output *)0x0) &&
                       (ppuVar15 = local_120, (sVar9 != 0x21) != (puVar11 != (uchar *)0x0)))
                    goto LAB_004b66de;
                    goto LAB_004b66e5;
                  }
                  goto LAB_004b67f6;
                }
                break;
              default:
                pppwVar17 = (wally_tx_witness_stack ***)((ulong)local_160 & 0xffffffff);
                iVar21 = 5;
              }
            }
            else {
LAB_004b6167:
              pppwVar17 = (wally_tx_witness_stack ***)((ulong)local_160 & 0xffffffff);
            }
            if (iVar21 == 4) {
              local_160 = (wally_tx_witness_stack **)CONCAT44(local_160._4_4_,(int)pppwVar17);
              goto LAB_004b63d8;
            }
            if (iVar21 == 5) {
              local_160 = (wally_tx_witness_stack **)CONCAT44(local_160._4_4_,(int)pppwVar17);
              goto LAB_004b61c5;
            }
          }
LAB_004b61e7:
          bVar1 = false;
        }
LAB_004b63e8:
        local_160 = (wally_tx_witness_stack **)CONCAT44(local_160._4_4_,(int)pppwVar17);
      } while (bVar1);
      if ((int)pppwVar17 != 0) goto LAB_004b4cc4;
      pwVar14 = (wally_psbt_output *)((long)&local_c8->redeem_script + 1);
    } while (pwVar14 < (wally_psbt_output *)local_150->tx->num_outputs);
  }
  pppwVar17 = (wally_tx_witness_stack ***)0xfffffffe;
  if (local_180 != (wally_tx_witness_stack **)0x0) {
    *local_90 = local_150;
    pppwVar18 = (wally_tx_witness_stack ***)0x0;
    goto LAB_004b4cd1;
  }
LAB_004b4cc4:
  wally_psbt_free(local_150);
  pppwVar18 = pppwVar17;
LAB_004b4cd1:
  return (int)pppwVar18;
}

Assistant:

int wally_psbt_from_bytes(const unsigned char *bytes, size_t len,
                          struct wally_psbt **output)
{
    const unsigned char *magic, *pre_key;
    int ret;
    size_t i, key_len;
    struct wally_psbt *result = NULL;
    uint32_t flags = 0, pre144flag = WALLY_TX_FLAG_PRE_BIP144;

    TX_CHECK_OUTPUT;

    magic = pull_skip(&bytes, &len, sizeof(PSBT_MAGIC));
    if (!magic) {
        ret = WALLY_EINVAL;  /* Not enough bytes */
        goto fail;
    }
    if (memcmp(magic, PSBT_MAGIC, sizeof(PSBT_MAGIC)) != 0 ) {
#ifdef BUILD_ELEMENTS
        if (memcmp(magic, PSET_MAGIC, sizeof(PSET_MAGIC)) != 0) {
            ret = WALLY_EINVAL;  /* Invalid Magic */
            goto fail;
        }
        flags |= WALLY_TX_FLAG_USE_ELEMENTS;
        pre144flag = 0;
#else
        ret = WALLY_EINVAL;  /* Invalid Magic */
        goto fail;
#endif /* BUILD_ELEMENTS */
    }

    /* Make the wally_psbt */
    if ((ret = wally_psbt_init_alloc(0, 0, 0, 8, &result)) != WALLY_OK)
        goto fail;

    /* Set the magic */
    memcpy(result->magic, magic, sizeof(PSBT_MAGIC));

    /* Read globals first */
    pre_key = bytes;
    while ((key_len = pull_varlength(&bytes, &len)) != 0) {
        const unsigned char *key, *val;
        size_t val_max;

        /* Start parsing key */
        pull_subfield_start(&bytes, &len, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_GLOBAL_UNSIGNED_TX: {
            struct wally_tx *tx;

            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            ret = wally_tx_from_bytes(val, val_max, flags | pre144flag, &tx);
            if (ret == WALLY_OK) {
                ret = psbt_set_global_tx(result, tx, false);
                if (ret != WALLY_OK)
                    wally_tx_free(tx);
            }
            if (ret != WALLY_OK)
                goto fail;
            pull_subfield_end(&bytes, &len, val, val_max);
            break;
        }
        case PSBT_GLOBAL_VERSION: {
            if (result->version > 0) {
                ret = WALLY_EINVAL;    /* Version already provided */
                goto fail;
            }
            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            result->version = pull_le32(&val, &val_max);
            subfield_nomore_end(&bytes, &len, val, val_max);
            if (result->version > WALLY_PSBT_HIGHEST_VERSION) {
                ret = WALLY_EINVAL;    /* Unsupported version number */
                goto fail;
            }
            break;
        }
        /* Unknowns */
        default: {
            ret = pull_unknown_key_value(&bytes, &len, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                goto fail;
            break;
        }
        }
        pre_key = bytes;
    }

    /* We don't technically need to test here, but it's a minor optimization */
    if (!bytes) {
        ret = WALLY_EINVAL; /* Missing global separator */
        goto fail;
    }

    if (!result->tx) {
        ret = WALLY_EINVAL; /* No global tx */
        goto fail;
    }

    /* Read inputs */
    for (i = 0; i < result->tx->num_inputs; ++i) {
        ret = pull_psbt_input(&bytes, &len, flags, &result->inputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* Read outputs */
    for (i = 0; i < result->tx->num_outputs; ++i) {
        ret = pull_psbt_output(&bytes, &len, &result->outputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* If we ran out of data anywhere, fail. */
    if (!bytes) {
        ret = WALLY_EINVAL;
        goto fail;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_psbt_free(result);
    return ret;
}